

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this,uint32_t numChannels,uint32_t targetBits)

{
  Color CVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint32_t uVar3;
  uint uVar4;
  float *__src;
  uint32_t uVar5;
  uint uVar6;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 *__dest;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  uint16_t outValue_1;
  float outValue;
  ushort local_4c;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  float local_3c;
  ulong local_38;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  uVar8 = targetBits >> 3;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar8 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_49);
  uVar9 = (this->super_Image).height;
  pvVar2 = local_48;
  if (uVar9 != 0) {
    local_38 = (ulong)uVar8;
    uVar5 = (this->super_Image).width;
    uVar7 = 0;
    uVar3 = uVar5;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if (numChannels == 1) {
            uVar6 = uVar5 * uVar7 + uVar9;
            CVar1.field_0 =
                 (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
                 this->pixels[uVar6].field_0.comps[0];
            __dest = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 *)
                     ((pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar6 * uVar8);
            if (targetBits == 8) {
              __dest->comps[0] = (uchar)CVar1.field_0;
            }
            else {
              if (targetBits == 0x10) {
                fVar10 = (float)(byte)CVar1.field_0;
                uVar6 = (uint)fVar10 >> 0x17;
                if (uVar6 == 0) {
                  local_4c = 0;
                }
                else if (uVar6 == 0xff) {
                  local_4c = (((uint)fVar10 & 0x7fffff) != 0 | 0x3e) << 9;
                }
                else {
                  local_4c = 0x7c00;
                  if ((uint)fVar10 < 0x47800000) {
                    if ((uint)fVar10 < 0x38800000) {
                      if ((uint)fVar10 < 0x33000000) {
                        local_4c = 0;
                        goto LAB_0012303a;
                      }
                      uVar4 = (uint)fVar10 & 0x7fffff | 0x800000;
                      local_4c = (ushort)(uVar4 >> (0x7eU - (char)uVar6 & 0x1f));
                      uVar4 = uVar4 >> ((byte)(0x7d - (char)uVar6) & 0x1f);
                    }
                    else {
                      local_4c = ((ushort)((uint)fVar10 >> 0xd) & 0x3ff |
                                 (ushort)((uVar6 & 0x1f) << 10)) ^ 0x4000;
                      uVar4 = (uint)fVar10 >> 0xc;
                    }
                    local_4c = local_4c + ((uVar4 & 1) != 0);
                  }
LAB_0012303a:
                  local_4c = local_4c & 0x7fff;
                }
                __src = (float *)&local_4c;
              }
              else {
                if (targetBits != 0x20) goto LAB_00123058;
                local_3c = (float)(byte)CVar1.field_0;
                __src = &local_3c;
              }
              memcpy(__dest,__src,local_38);
              pvVar2 = local_48;
            }
LAB_00123058:
            uVar5 = (this->super_Image).width;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar5);
        uVar9 = (this->super_Image).height;
        uVar3 = uVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar9);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }